

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O2

int lws_h2_num(int starting_bits,unsigned_long num,uchar **p,uchar *end)

{
  byte *pbVar1;
  bool bVar2;
  undefined4 in_register_0000003c;
  ulong uVar3;
  byte bVar4;
  
  if (0x7e < CONCAT44(in_register_0000003c,starting_bits)) {
    uVar3 = CONCAT44(in_register_0000003c,starting_bits) - 0x7f;
    do {
      bVar4 = (byte)uVar3 | 0x80;
      if (uVar3 < 0x80) {
        bVar4 = (byte)uVar3;
      }
      pbVar1 = *(byte **)num;
      *(byte **)num = pbVar1 + 1;
      *pbVar1 = bVar4;
      if (p <= *(uchar ***)num) {
        return 1;
      }
      bVar2 = 0x7f < uVar3;
      uVar3 = uVar3 >> 7;
    } while (bVar2);
  }
  return 0;
}

Assistant:

static int
lws_h2_num(int starting_bits, unsigned long num,
			 unsigned char **p, unsigned char *end)
{
	unsigned int mask = (1 << starting_bits) - 1;

	if (num < mask)
		return 0;

	num -= mask;
	do {
		if (num > 127)
			*((*p)++) = 0x80 | (num & 0x7f);
		else
			*((*p)++) = 0x00 | (num & 0x7f);
		if (*p >= end)
			return 1;
		num >>= 7;
	} while (num);

	return 0;
}